

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_TreePhases_rec(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vMap,int Node,int fPhase,
                        Vec_Bit_t *vVisit)

{
  int Node_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint local_74;
  
  if (Node == 0) {
    __assert_fail("Node != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                  ,0x188,
                  "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                 );
  }
  if ((Node < 0) || (vMap->nSize <= Node)) goto LAB_0067777b;
  uVar4 = vMap->pArray[(uint)Node];
  if (uVar4 != 0xffffffff) {
    if (((int)uVar4 < 0) || (uVar3 = uVar4 * 6 + 4, vAdds->nSize <= (int)uVar3)) {
LAB_0067777b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar1 = vAdds->pArray;
    if (piVar1[uVar3] != Node) {
      __assert_fail("Node == Vec_IntEntry( vAdds, 6*iBox+4 )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0x18c,
                    "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                   );
    }
    if (vVisit->nSize <= (int)uVar4) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
    uVar3 = vVisit->pArray[uVar4 >> 5];
    if ((uVar3 >> (uVar4 & 0x1f) & 1) != 0) {
      return;
    }
    uVar2 = uVar4 * 6;
    vVisit->pArray[uVar4 >> 5] = uVar3 | 1 << (uVar4 & 0x1f);
    if ((vAdds->nSize <= (int)(uVar2 + 3)) || (uVar4 = uVar2 + 5, vAdds->nSize <= (int)uVar4))
    goto LAB_0067777b;
    uVar3 = piVar1[uVar4];
    uVar6 = uVar3 >> 3 & 1;
    local_74 = fPhase;
    if (piVar1[(ulong)uVar2 + 2] == 0) {
      uVar5 = uVar3 >> 2 & 1;
      local_74 = uVar5 ^ fPhase;
      uVar6 = uVar6 ^ local_74;
      if (uVar5 != fPhase) {
        piVar1[uVar4] = uVar3 | 0x40000;
      }
    }
    lVar7 = 0;
    do {
      if ((int)uVar2 < 0) goto LAB_0067777b;
      if (vAdds->nSize <= (int)(uVar2 + (uint)lVar7)) goto LAB_0067777b;
      Node_00 = vAdds->pArray[(ulong)uVar2 + lVar7];
      if (Node_00 != 0) {
        if (vAdds->nSize <= (int)uVar4) goto LAB_0067777b;
        uVar3 = (uint)(((uint)vAdds->pArray[uVar4] >> ((uint)lVar7 & 0x1f) & 1) != 0);
        uVar5 = uVar3 ^ local_74;
        uVar6 = uVar6 ^ uVar5;
        Acec_TreePhases_rec(p,vAdds,vMap,Node_00,uVar5,vVisit);
        if (uVar3 != local_74) {
          if (vAdds->nSize <= (int)uVar4) goto LAB_0067779a;
          vAdds->pArray[uVar4] = vAdds->pArray[uVar4] | 0x10000 << ((byte)lVar7 & 0x1f);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (uVar6 != 0) {
      if (vAdds->nSize <= (int)uVar4) goto LAB_0067779a;
      vAdds->pArray[uVar4] = vAdds->pArray[uVar4] | 0x80000;
    }
    if (local_74 != 0) {
      if (vAdds->nSize <= (int)uVar4) {
LAB_0067779a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      vAdds->pArray[uVar4] = vAdds->pArray[uVar4] | 0x100000;
    }
  }
  return;
}

Assistant:

void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit )
{
    int k, iBox, iXor, fXorPhase, fPhaseThis;
    assert( Node != 0 );
    iBox = Vec_IntEntry( vMap, Node );
    if ( iBox == -1 )
        return;
    assert( Node == Vec_IntEntry( vAdds, 6*iBox+4 ) );
    if ( Vec_BitEntry(vVisit, iBox) )
        return;
    Vec_BitWriteEntry( vVisit, iBox, 1 );
    iXor = Vec_IntEntry( vAdds, 6*iBox+3 );
    fXorPhase = Acec_SignBit(vAdds, iBox, 3);
    if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
    {
        //fPhaseThis = Acec_SignBit( vAdds, iBox, 2 ) ^ fPhase;
        //fXorPhase ^= fPhaseThis;
        //Acec_SignSetBit2( vAdds, iBox, 2, fPhaseThis ); // complemented HADD -- create const1 input
        fPhase ^= Acec_SignBit( vAdds, iBox, 2 );
        fXorPhase ^= fPhase;
        Acec_SignSetBit2( vAdds, iBox, 2, fPhase ); // complemented HADD -- create const1 input
    }
    for ( k = 0; k < 3; k++ )
    {
        int iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        fPhaseThis = Acec_SignBit(vAdds, iBox, k) ^ fPhase;
        fXorPhase ^= fPhaseThis;
        Acec_TreePhases_rec( p, vAdds, vMap, iObj, fPhaseThis, vVisit );
        Acec_SignSetBit2( vAdds, iBox, k, fPhaseThis );
    }
    Acec_SignSetBit2( vAdds, iBox, 3, fXorPhase );
    Acec_SignSetBit2( vAdds, iBox, 4, fPhase );
}